

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

float ldamath::fastpow2(float p)

{
  float fVar1;
  float local_20;
  float v;
  uint32_t approx;
  float z;
  int w;
  float clipp;
  float offset;
  float p_local;
  
  local_20 = p;
  if (p < -126.0) {
    local_20 = -126.0;
  }
  fVar1 = (local_20 - (float)(int)local_20) + (float)(p < 0.0) * 1.0;
  return (float)(long)((fVar1 * -1.4901291 + local_20 + 121.274086 + 27.728024 / (4.8425255 - fVar1)
                       ) * 8388608.0);
}

Assistant:

inline float fastpow2(float p)
{
  float offset = (p < 0) * 1.0f;
  float clipp = (p < -126.0) ? -126.0f : p;
  int w = (int)clipp;
  float z = clipp - w + offset;
  uint32_t approx = (uint32_t)((1 << 23) * (clipp + 121.2740838f + 27.7280233f / (4.84252568f - z) - 1.49012907f * z));

  float v;
  memcpy(&v, &approx, sizeof(uint32_t));
  return v;
}